

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall
net_tests::cnetaddr_tostring_canonical_ipv6::test_method(cnetaddr_tostring_canonical_ipv6 *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  type *ptVar2;
  long in_FS_OFFSET;
  type *expected_canonical_representation_output;
  type *input_address;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  optional<CNetAddr> net_addr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  canonical_representations_ipv6;
  char *in_stack_fffffffffffff368;
  type *in_stack_fffffffffffff370;
  char *in_stack_fffffffffffff378;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_fffffffffffff380;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_fffffffffffff388;
  const_string *in_stack_fffffffffffff390;
  size_t in_stack_fffffffffffff398;
  const_string *in_stack_fffffffffffff3a0;
  DNSLookupFn *in_stack_fffffffffffff3a8;
  undefined7 in_stack_fffffffffffff3b0;
  undefined1 in_stack_fffffffffffff3b7;
  undefined7 in_stack_fffffffffffff3b8;
  undefined1 in_stack_fffffffffffff3bf;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff3c0;
  undefined8 in_stack_fffffffffffff3d0;
  undefined7 in_stack_fffffffffffff3d8;
  undefined1 in_stack_fffffffffffff3df;
  undefined1 *local_be8;
  const_string local_b30 [2];
  lazy_ostream local_b10;
  assertion_result local_af0 [3];
  _Base_ptr local_a98;
  _Base_ptr local_a90;
  undefined1 local_a38 [2560];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[40],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [40])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [3])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[30],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [30])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [3])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [32])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [3])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [24])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [3])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[16],_const_char_(&)[3],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [16])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [3])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[16],_const_char_(&)[4],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [16])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [4])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[19],_const_char_(&)[14],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [19])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [14])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[22],_const_char_(&)[18],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [22])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[40],_const_char_(&)[29],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [40])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [29])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[16],_const_char_(&)[12],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [16])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [12])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[14],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [14])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[19],_const_char_(&)[18],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [19])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[18],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[24],_const_char_(&)[21],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [24])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[14],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [14])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[12],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [12])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[18],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[18],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[18],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[16],_const_char_(&)[12],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [16])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [12])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[21],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[21],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_(&)[12],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [14])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [12])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[29],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [32])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [29])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_(&)[12],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [14])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [12])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[18],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [20])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[12],_const_char_(&)[12],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [12])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [12])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[12],_const_char_(&)[12],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [12])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [12])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[18],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [18])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[21],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [20])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_const_char_(&)[21],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [21])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[33],_const_char_(&)[33],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [33])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [33])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[33],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [32])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [33])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[39],_const_char_(&)[36],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [39])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [36])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[38],_const_char_(&)[36],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [38])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [36])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[37],_const_char_(&)[36],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [37])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [36])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[36],_const_char_(&)[36],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [36])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [36])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[39],_const_char_(&)[39],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [39])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [39])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[39],_const_char_(&)[39],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [39])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [39])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[39],_const_char_(&)[39],_true>
            (in_stack_fffffffffffff3c0,
             (char (*) [39])CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
             (char (*) [39])CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff368);
  __l._M_len._0_7_ = in_stack_fffffffffffff3d8;
  __l._M_array = (iterator)in_stack_fffffffffffff3d0;
  __l._M_len._7_1_ = in_stack_fffffffffffff3df;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)in_stack_fffffffffffff3c0,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
        (allocator_type *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff368);
  local_be8 = local_38;
  do {
    local_be8 = local_be8 + -0x40;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_fffffffffffff368);
  } while (local_be8 != local_a38);
  local_a90 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff370);
  local_a98 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)in_stack_fffffffffffff370);
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffff378,
                                 (_Self *)in_stack_fffffffffffff370), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff368);
    std::get<0ul,std::__cxx11::string_const,std::__cxx11::string>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff368);
    ptVar2 = std::get<1ul,std::__cxx11::string_const,std::__cxx11::string>
                       ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffff368);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(in_stack_fffffffffffff388,in_stack_fffffffffffff380);
    LookupHost((string *)CONCAT17(in_stack_fffffffffffff3bf,in_stack_fffffffffffff3b8),
               (bool)in_stack_fffffffffffff3b7,in_stack_fffffffffffff3a8);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                 *)in_stack_fffffffffffff368);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff378,
                 (pointer)in_stack_fffffffffffff370,(unsigned_long)in_stack_fffffffffffff368);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff368);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0,
                 in_stack_fffffffffffff398,in_stack_fffffffffffff390);
      std::optional<CNetAddr>::value((optional<CNetAddr> *)in_stack_fffffffffffff378);
      CNetAddr::IsIPv6((CNetAddr *)in_stack_fffffffffffff368);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffff378,
                 SUB81((ulong)in_stack_fffffffffffff370 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff378,
                 (pointer)in_stack_fffffffffffff370,(unsigned_long)in_stack_fffffffffffff368);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff370,
                 (basic_cstring<const_char> *)in_stack_fffffffffffff368);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff378,
                 (pointer)in_stack_fffffffffffff370,(unsigned_long)in_stack_fffffffffffff368);
      in_stack_fffffffffffff368 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_af0,&local_b10,local_b30,0x144,REQUIRE,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffff368);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffff368);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff378,
                 (pointer)in_stack_fffffffffffff370,(unsigned_long)in_stack_fffffffffffff368);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff368);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0,
                 in_stack_fffffffffffff398,in_stack_fffffffffffff390);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffff370,(char (*) [1])in_stack_fffffffffffff368);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff378,
                 (pointer)in_stack_fffffffffffff370,(unsigned_long)in_stack_fffffffffffff368);
      std::optional<CNetAddr>::value((optional<CNetAddr> *)in_stack_fffffffffffff378);
      CNetAddr::ToStringAddr_abi_cxx11_
                ((CNetAddr *)CONCAT17(in_stack_fffffffffffff3b7,in_stack_fffffffffffff3b0));
      in_stack_fffffffffffff378 = "expected_canonical_representation_output";
      in_stack_fffffffffffff368 = "net_addr.value().ToStringAddr()";
      in_stack_fffffffffffff370 = ptVar2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (&stack0xfffffffffffff490,&stack0xfffffffffffff480,0x145,1,2);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff368);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff368);
      in_stack_fffffffffffff3bf = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff3bf);
    std::optional<CNetAddr>::~optional((optional<CNetAddr> *)in_stack_fffffffffffff368);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff368);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_stack_fffffffffffff368);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(cnetaddr_tostring_canonical_ipv6)
{
    // Test that CNetAddr::ToString formats IPv6 addresses with zero compression as described in
    // RFC 5952 ("A Recommendation for IPv6 Address Text Representation").
    const std::map<std::string, std::string> canonical_representations_ipv6{
        {"0000:0000:0000:0000:0000:0000:0000:0000", "::"},
        {"000:0000:000:00:0:00:000:0000", "::"},
        {"000:000:000:000:000:000:000:000", "::"},
        {"00:00:00:00:00:00:00:00", "::"},
        {"0:0:0:0:0:0:0:0", "::"},
        {"0:0:0:0:0:0:0:1", "::1"},
        {"2001:0:0:1:0:0:0:1", "2001:0:0:1::1"},
        {"2001:0db8:0:0:1:0:0:1", "2001:db8::1:0:0:1"},
        {"2001:0db8:85a3:0000:0000:8a2e:0370:7334", "2001:db8:85a3::8a2e:370:7334"},
        {"2001:0db8::0001", "2001:db8::1"},
        {"2001:0db8::0001:0000", "2001:db8::1:0"},
        {"2001:0db8::1:0:0:1", "2001:db8::1:0:0:1"},
        {"2001:db8:0000:0:1::1", "2001:db8::1:0:0:1"},
        {"2001:db8:0000:1:1:1:1:1", "2001:db8:0:1:1:1:1:1"},
        {"2001:db8:0:0:0:0:2:1", "2001:db8::2:1"},
        {"2001:db8:0:0:0::1", "2001:db8::1"},
        {"2001:db8:0:0:1:0:0:1", "2001:db8::1:0:0:1"},
        {"2001:db8:0:0:1::1", "2001:db8::1:0:0:1"},
        {"2001:DB8:0:0:1::1", "2001:db8::1:0:0:1"},
        {"2001:db8:0:0::1", "2001:db8::1"},
        {"2001:db8:0:0:aaaa::1", "2001:db8::aaaa:0:0:1"},
        {"2001:db8:0:1:1:1:1:1", "2001:db8:0:1:1:1:1:1"},
        {"2001:db8:0::1", "2001:db8::1"},
        {"2001:db8:85a3:0:0:8a2e:370:7334", "2001:db8:85a3::8a2e:370:7334"},
        {"2001:db8::0:1", "2001:db8::1"},
        {"2001:db8::0:1:0:0:1", "2001:db8::1:0:0:1"},
        {"2001:DB8::1", "2001:db8::1"},
        {"2001:db8::1", "2001:db8::1"},
        {"2001:db8::1:0:0:1", "2001:db8::1:0:0:1"},
        {"2001:db8::1:1:1:1:1", "2001:db8:0:1:1:1:1:1"},
        {"2001:db8::aaaa:0:0:1", "2001:db8::aaaa:0:0:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:0:1", "2001:db8:aaaa:bbbb:cccc:dddd:0:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd::1", "2001:db8:aaaa:bbbb:cccc:dddd:0:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:0001", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:001", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:01", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:1", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:1"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:AAAA", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa"},
        {"2001:db8:aaaa:bbbb:cccc:dddd:eeee:AaAa", "2001:db8:aaaa:bbbb:cccc:dddd:eeee:aaaa"},
    };
    for (const auto& [input_address, expected_canonical_representation_output] : canonical_representations_ipv6) {
        const std::optional<CNetAddr> net_addr{LookupHost(input_address, false)};
        BOOST_REQUIRE(net_addr.value().IsIPv6());
        BOOST_CHECK_EQUAL(net_addr.value().ToStringAddr(), expected_canonical_representation_output);
    }
}